

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

PackedSlice * __thiscall kratos::PackedSlice::slice_member(PackedSlice *this,string *member_name)

{
  undefined1 auVar1 [8];
  int iVar2;
  undefined4 extraout_var;
  PackedSlice *struct_;
  shared_ptr<kratos::PortPackedStruct> sVar3;
  shared_ptr<kratos::VarPackedStruct> sVar4;
  PackedSlice *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::PackedSlice> p;
  
  struct_ = (PackedSlice *)this->original_struct_;
  if ((PackedSlice *)this->original_struct_ == (PackedSlice *)0x0) {
    iVar2 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x17])(this);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x29])(this);
      if (*(int *)(CONCAT44(extraout_var,iVar2) + 0x168) == 4) {
        sVar3 = Var::as<kratos::PortPackedStruct>((Var *)local_40);
        (*(((VarSlice *)local_40)->super_Var).super_IRNode._vptr_IRNode[0x2e])
                  (&local_50,local_40,
                   sVar3.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      else {
        sVar4 = Var::as<kratos::VarPackedStruct>((Var *)local_40);
        (*(((VarSlice *)local_40)->super_Var).super_IRNode._vptr_IRNode[0x2d])
                  (&local_50,local_40,
                   sVar4.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      struct_ = local_50;
      if (p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    else {
      struct_ = (PackedSlice *)this->def_->struct_;
    }
  }
  local_40 = (undefined1  [8])0x0;
  local_50 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::PackedSlice,std::allocator<kratos::PackedSlice>,kratos::PackedSlice*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(PackedSlice **)local_40,
             (allocator<kratos::PackedSlice> *)
             ((long)&p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),&local_50);
  std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::PackedSlice,kratos::PackedSlice>
            ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)local_40,
             (PackedSlice *)local_40);
  set_up((PackedSlice *)local_40,(PackedStruct *)struct_,member_name);
  std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
  emplace_back<std::shared_ptr<kratos::PackedSlice>&>
            ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&(this->super_VarSlice).super_Var.slices_,
             (shared_ptr<kratos::PackedSlice> *)local_40);
  auVar1 = local_40;
  if (p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (PackedSlice *)auVar1;
}

Assistant:

PackedSlice &PackedSlice::slice_member(const std::string &member_name) {
    const PackedStruct *struct_;
    if (original_struct_) {
        struct_ = original_struct_;
    } else if (is_struct()) {
        struct_ = def_->struct_;
    } else {
        auto *root = get_var_root_parent();
        if (root->type() == VarType::PortIO) {
            auto v = root->as<PortPackedStruct>();
            struct_ = v->packed_struct().get();
        } else {
            auto v = root->as<VarPackedStruct>();
            struct_ = v->packed_struct().get();
        }
    }
    std::shared_ptr<PackedSlice> p = ::make_shared<PackedSlice>(this);
    p->set_up(*struct_, member_name);
    slices_.emplace_back(p);
    return *p;
}